

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall spdlog::logger::~logger(logger *this)

{
  undefined8 *in_RDI;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__logger_00278e28;
  details::backtracer::~backtracer((backtracer *)0x1ae8fa);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x1ae908);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~logger() = default;